

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Finalize(VersionSet *this,Version *v)

{
  size_type sVar1;
  int64_t iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint64_t level_bytes;
  double score;
  double dStack_28;
  int level;
  double best_score;
  int best_level;
  Version *v_local;
  VersionSet *this_local;
  
  best_score._4_4_ = -1;
  dStack_28 = -1.0;
  for (score._4_4_ = 0; score._4_4_ < 6; score._4_4_ = score._4_4_ + 1) {
    if (score._4_4_ == 0) {
      sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (v->files_);
      auVar4._8_4_ = (int)(sVar1 >> 0x20);
      auVar4._0_8_ = sVar1;
      auVar4._12_4_ = 0x45300000;
      level_bytes = (uint64_t)
                    (((auVar4._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) / 4.0);
    }
    else {
      iVar2 = TotalFileSize(v->files_ + score._4_4_);
      auVar5._8_4_ = (int)((ulong)iVar2 >> 0x20);
      auVar5._0_8_ = iVar2;
      auVar5._12_4_ = 0x45300000;
      dVar3 = MaxBytesForLevel(this->options_,score._4_4_);
      level_bytes = (uint64_t)
                    (((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)iVar2) - 4503599627370496.0)) / dVar3);
    }
    if (dStack_28 < (double)level_bytes) {
      best_score._4_4_ = score._4_4_;
      dStack_28 = (double)level_bytes;
    }
  }
  v->compaction_level_ = best_score._4_4_;
  v->compaction_score_ = dStack_28;
  return;
}

Assistant:

void VersionSet::Finalize(Version* v) {
  // Precomputed best level for next compaction
  int best_level = -1;
  double best_score = -1;

  for (int level = 0; level < config::kNumLevels - 1; level++) {
    double score;
    if (level == 0) {
      // We treat level-0 specially by bounding the number of files
      // instead of number of bytes for two reasons:
      //
      // (1) With larger write-buffer sizes, it is nice not to do too
      // many level-0 compactions.
      //
      // (2) The files in level-0 are merged on every read and
      // therefore we wish to avoid too many files when the individual
      // file size is small (perhaps because of a small write-buffer
      // setting, or very high compression ratios, or lots of
      // overwrites/deletions).
      score = v->files_[level].size() /
              static_cast<double>(config::kL0_CompactionTrigger);
    } else {
      // Compute the ratio of current size to size limit.
      const uint64_t level_bytes = TotalFileSize(v->files_[level]);
      score =
          static_cast<double>(level_bytes) / MaxBytesForLevel(options_, level);
    }

    if (score > best_score) {
      best_level = level;
      best_score = score;
    }
  }

  v->compaction_level_ = best_level;
  v->compaction_score_ = best_score;
}